

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

Aig_Man_t * Gia_ManToAigSkip(Gia_Man_t *p,int nOutDelta)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t **ppNodes_00;
  Aig_Obj_t *pAVar3;
  Gia_Obj_t *pObj_00;
  bool bVar4;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Aig_Obj_t **ppNodes;
  Aig_Man_t *pNew;
  int nOutDelta_local;
  Gia_Man_t *p_local;
  
  if ((p->pNexts != (int *)0x0) || (p->pReprs != (Gia_Rpr_t *)0x0)) {
    __assert_fail("p->pNexts == NULL && p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x14a,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
  }
  if ((0 < nOutDelta) && (iVar1 = Gia_ManCoNum(p), iVar1 % nOutDelta == 0)) {
    iVar1 = Gia_ManAndNum(p);
    p_00 = Aig_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar2;
    p_00->nConstrs = p->nConstrs;
    iVar1 = Gia_ManObjNum(p);
    ppNodes_00 = (Aig_Obj_t **)calloc((long)iVar1,8);
    pAVar3 = Aig_ManConst0(p_00);
    *ppNodes_00 = pAVar3;
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar4 = false;
      if (local_34 < iVar1) {
        pGStack_30 = Gia_ManCi(p,local_34);
        bVar4 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pAVar3 = Aig_ObjCreateCi(p_00);
      iVar1 = Gia_ObjId(p,pGStack_30);
      ppNodes_00[iVar1] = pAVar3;
      local_34 = local_34 + 1;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (local_34 < iVar1) {
        pGStack_30 = Gia_ManCo(p,local_34);
        bVar4 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pObj_00 = Gia_ObjFanin0(pGStack_30);
      Gia_ManToAig_rec(p_00,ppNodes_00,p,pObj_00);
      if (local_34 % nOutDelta == 0) {
        iVar1 = Gia_ObjId(p,pGStack_30);
        pAVar3 = Gia_ObjChild0Copy2(ppNodes_00,pGStack_30,iVar1);
        pAVar3 = Aig_ObjCreateCo(p_00,pAVar3);
        iVar1 = Gia_ObjId(p,pGStack_30);
        ppNodes_00[iVar1] = pAVar3;
      }
      local_34 = local_34 + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    Aig_ManSetRegNum(p_00,iVar1);
    if (ppNodes_00 != (Aig_Obj_t **)0x0) {
      free(ppNodes_00);
    }
    return p_00;
  }
  __assert_fail("nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                ,0x14b,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
}

Assistant:

Aig_Man_t * Gia_ManToAigSkip( Gia_Man_t * p, int nOutDelta )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pNexts == NULL && p->pReprs == NULL );
    assert( nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0 );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManAndNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
//    pNew->pSpec = Abc_UtilStrsav( p->pName );
    // create the PIs
    ppNodes = ABC_CALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    ppNodes[0] = Aig_ManConst0(pNew);
    Gia_ManForEachCi( p, pObj, i )
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCi( pNew );
    // add logic for the POs
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManToAig_rec( pNew, ppNodes, p, Gia_ObjFanin0(pObj) );        
        if ( i % nOutDelta != 0 )
            continue;
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}